

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O0

char * luaL_tolstring(lua_State *L,int idx,size_t *len)

{
  int iVar1;
  int iVar2;
  int t;
  void *pvVar3;
  char *pcVar4;
  char *local_90;
  char *kind;
  char local_68 [4];
  int tt;
  char buff [64];
  size_t *len_local;
  int idx_local;
  lua_State *L_local;
  
  iVar1 = lua_absindex(L,idx);
  iVar2 = luaL_callmeta(L,iVar1,"__tostring");
  if (iVar2 == 0) {
    iVar2 = lua_type(L,iVar1);
    switch(iVar2) {
    case 0:
      lua_pushstring(L,"nil");
      break;
    case 1:
      iVar1 = lua_toboolean(L,iVar1);
      pcVar4 = "false";
      if (iVar1 != 0) {
        pcVar4 = "true";
      }
      lua_pushstring(L,pcVar4);
      break;
    default:
      iVar2 = luaL_getmetafield(L,iVar1,"__name");
      if (iVar2 == 4) {
        local_90 = lua_tolstring(L,-1,(size_t *)0x0);
      }
      else {
        t = lua_type(L,iVar1);
        local_90 = lua_typename(L,t);
      }
      pvVar3 = lua_topointer(L,iVar1);
      lua_pushfstring(L,"%s: %p",local_90,pvVar3);
      if (iVar2 != 0) {
        lua_rotate(L,-2,-1);
        lua_settop(L,-2);
      }
      break;
    case 3:
      lua_numbertocstring(L,iVar1,local_68);
      lua_pushstring(L,local_68);
      break;
    case 4:
      lua_pushvalue(L,iVar1);
    }
  }
  else {
    iVar1 = lua_isstring(L,-1);
    if (iVar1 == 0) {
      luaL_error(L,"\'__tostring\' must return a string");
    }
  }
  pcVar4 = lua_tolstring(L,-1,len);
  return pcVar4;
}

Assistant:

LUALIB_API const char *luaL_tolstring (lua_State *L, int idx, size_t *len) {
  idx = lua_absindex(L,idx);
  if (luaL_callmeta(L, idx, "__tostring")) {  /* metafield? */
    if (!lua_isstring(L, -1))
      luaL_error(L, "'__tostring' must return a string");
  }
  else {
    switch (lua_type(L, idx)) {
      case LUA_TNUMBER: {
        char buff[LUA_N2SBUFFSZ];
        lua_numbertocstring(L, idx, buff);
        lua_pushstring(L, buff);
        break;
      }
      case LUA_TSTRING:
        lua_pushvalue(L, idx);
        break;
      case LUA_TBOOLEAN:
        lua_pushstring(L, (lua_toboolean(L, idx) ? "true" : "false"));
        break;
      case LUA_TNIL:
        lua_pushliteral(L, "nil");
        break;
      default: {
        int tt = luaL_getmetafield(L, idx, "__name");  /* try name */
        const char *kind = (tt == LUA_TSTRING) ? lua_tostring(L, -1) :
                                                 luaL_typename(L, idx);
        lua_pushfstring(L, "%s: %p", kind, lua_topointer(L, idx));
        if (tt != LUA_TNIL)
          lua_remove(L, -2);  /* remove '__name' */
        break;
      }
    }
  }
  return lua_tolstring(L, -1, len);
}